

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.h
# Opt level: O0

uint64_t zng_memread_8(void *ptr)

{
  void *ptr_local;
  
  return *ptr;
}

Assistant:

static inline uint64_t zng_memread_8(const void *ptr) {
#if defined(HAVE_MAY_ALIAS)
    typedef struct { uint64_t val; } __attribute__ ((__packed__, __may_alias__)) unaligned_uint64_t;
    return ((const unaligned_uint64_t *)ptr)->val;
#else
    uint64_t val;
    memcpy(&val, ptr, sizeof(val));
    return val;
#endif
}